

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O2

void __thiscall Poisson::Poisson(Poisson *this,Time *time,string *name,string *type)

{
  allocator<char> local_31;
  string local_30;
  
  StochasticEventGenerator::StochasticEventGenerator
            (&this->super_StochasticEventGenerator,time,name,type);
  RandN::RandN((RandN *)this);
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__Poisson_00156958;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__Poisson_001569f0;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__Poisson_00156a38;
  this->poissonRate =
       ((this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
        super_TimeDependent.xTime)->dt * 5.0;
  std::__cxx11::string::assign
            ((char *)&(this->super_StochasticEventGenerator).super_StochasticVariable.
                      super_StochasticProcess.stochDescription);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"rate",&local_31);
  Parametric::addParameter((Parametric *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Poisson::Poisson(Time* time, const string& name, const string& type)
: StochasticEventGenerator(time, name, type)
{
	poissonRate = 5.0 * xTime->dt;
	stochDescription = "Poisson process";
	addParameter("rate");
}